

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1ac67::
ARTCorrectnessTest_TwoInstances_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTCorrectnessTest_TwoInstances_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  value_view v;
  reference pvVar1;
  const_reference pvVar2;
  void *__stat_loc;
  thread<TypeParam>_conflict second_thread;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  v2;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  v1;
  type local_920;
  qsbr_thread local_918 [6];
  bool in_stack_fffffffffffff71f;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff720;
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  local_500;
  
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffff720,in_stack_fffffffffffff71f);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier(in_stack_fffffffffffff720,in_stack_fffffffffffff71f);
  local_920.v2 = (tree_verifier<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                  *)(local_918 + 3);
  unodb::qsbr_thread::
  qsbr_thread<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_laurynas_biveinis[P]unodb_test_test_art_cpp:974:48)>
            (local_918,&local_920);
  __stat_loc = (void *)0x0;
  pvVar1 = std::array<unodb::detail::thread_sync,_6UL>::operator[]
                     ((array<unodb::detail::thread_sync,_6UL> *)unodb::detail::thread_syncs,0);
  unodb::detail::thread_sync::wait(pvVar1,__stat_loc);
  pvVar1 = std::array<unodb::detail::thread_sync,_6UL>::operator[]
                     ((array<unodb::detail::thread_sync,_6UL> *)unodb::detail::thread_syncs,1);
  unodb::detail::thread_sync::notify(pvVar1);
  pvVar2 = std::array<std::span<const_std::byte,_18446744073709551615UL>,_6UL>::operator[]
                     ((array<std::span<const_std::byte,_18446744073709551615UL>,_6UL> *)
                      unodb::test::test_values,1);
  v._M_ptr = pvVar2->_M_ptr;
  v._M_extent._M_extent_value = (pvVar2->_M_extent)._M_extent_value;
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert<int>(&local_500,0,v,false);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::check_present_values(&local_500);
  std::thread::join();
  unodb::qsbr_thread::~qsbr_thread(local_918);
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier((tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                    *)(local_918 + 3));
  unodb::test::
  tree_verifier<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::~tree_verifier(&local_500);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTCorrectnessTest, TwoInstances) {
  unodb::test::tree_verifier<TypeParam> v1;
  unodb::test::tree_verifier<TypeParam> v2;

  unodb::test::thread<TypeParam> second_thread([&v2] {
    thread_syncs[0].notify();
    thread_syncs[1].wait();

    v2.insert(0, unodb::test::test_values[0]);
    v2.check_present_values();
  });

  thread_syncs[0].wait();
  thread_syncs[1].notify();

  v1.insert(0, unodb::test::test_values[1]);
  v1.check_present_values();

  second_thread.join();
}